

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

void Gla_ManCollect(Gla_Man_t *p,Vec_Int_t *vPis,Vec_Int_t *vPPis,Vec_Int_t *vCos,Vec_Int_t *vRoAnds
                   )

{
  Gia_Man_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gla_Obj_t *pGVar4;
  Gla_Obj_t *pGVar5;
  bool bVar6;
  Vec_Int_t *local_90;
  int local_50;
  int local_4c;
  int k;
  int i;
  Gia_Obj_t *pGiaObj;
  Gla_Obj_t *pFanin;
  Gla_Obj_t *pObj;
  Vec_Int_t *vRoAnds_local;
  Vec_Int_t *vCos_local;
  Vec_Int_t *vPPis_local;
  Vec_Int_t *vPis_local;
  Gla_Man_t *p_local;
  
  pGVar1 = p->pGia;
  pGVar3 = Gia_ManPo(p->pGia,0);
  iVar2 = Gia_ObjId(pGVar1,pGVar3);
  Vec_IntPush(vCos,iVar2);
  local_4c = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vAbs);
    if (iVar2 <= local_4c) {
      Vec_IntUniqify(vPis);
      Vec_IntUniqify(vPPis);
      Vec_IntSort(vCos,0);
      Gia_ManIncrementTravId(p->pGia);
      pGVar1 = p->pGia;
      pGVar3 = Gia_ManConst0(p->pGia);
      Gia_ObjSetTravIdCurrent(pGVar1,pGVar3);
      local_4c = 0;
      while( true ) {
        iVar2 = Vec_IntSize(vPis);
        bVar6 = false;
        if (local_4c < iVar2) {
          pGVar1 = p->pGia;
          iVar2 = Vec_IntEntry(vPis,local_4c);
          _k = Gia_ManObj(pGVar1,iVar2);
          bVar6 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        Gia_ObjSetTravIdCurrent(p->pGia,_k);
        local_4c = local_4c + 1;
      }
      local_4c = 0;
      while( true ) {
        iVar2 = Vec_IntSize(vPPis);
        bVar6 = false;
        if (local_4c < iVar2) {
          pGVar1 = p->pGia;
          iVar2 = Vec_IntEntry(vPPis,local_4c);
          _k = Gia_ManObj(pGVar1,iVar2);
          bVar6 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        Gia_ObjSetTravIdCurrent(p->pGia,_k);
        local_4c = local_4c + 1;
      }
      local_4c = 0;
      while( true ) {
        iVar2 = Vec_IntSize(vCos);
        bVar6 = false;
        if (local_4c < iVar2) {
          pGVar1 = p->pGia;
          iVar2 = Vec_IntEntry(vCos,local_4c);
          _k = Gia_ManObj(pGVar1,iVar2);
          bVar6 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        if (local_4c != 0) {
          _k = Gia_ObjRiToRo(p->pGia,_k);
          Gia_ObjSetTravIdCurrent(p->pGia,_k);
          iVar2 = Gia_ObjId(p->pGia,_k);
          Vec_IntPush(vRoAnds,iVar2);
        }
        local_4c = local_4c + 1;
      }
      local_4c = 0;
      while( true ) {
        iVar2 = Vec_IntSize(vCos);
        bVar6 = false;
        if (local_4c < iVar2) {
          pGVar1 = p->pGia;
          iVar2 = Vec_IntEntry(vCos,local_4c);
          _k = Gia_ManObj(pGVar1,iVar2);
          bVar6 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        pGVar1 = p->pGia;
        pGVar3 = Gia_ObjFanin0(_k);
        Gla_ManCollectInternal_rec(pGVar1,pGVar3,vRoAnds);
        local_4c = local_4c + 1;
      }
      return;
    }
    iVar2 = Vec_IntEntry(p->vAbs,local_4c);
    pGVar4 = Gla_ManObj(p,iVar2);
    if ((((*(uint *)&pGVar4->field_0x4 >> 2 & 1) == 0) &&
        ((*(uint *)&pGVar4->field_0x4 >> 5 & 1) == 0)) &&
       ((*(uint *)&pGVar4->field_0x4 >> 7 & 1) == 0)) break;
    if ((*(uint *)&pGVar4->field_0x4 >> 5 & 1) != 0) {
      pGVar1 = p->pGia;
      pGVar3 = Gia_ManObj(p->pGia,pGVar4->iGiaObj);
      _k = Gia_ObjRoToRi(pGVar1,pGVar3);
      iVar2 = Gia_ObjId(p->pGia,_k);
      Vec_IntPush(vCos,iVar2);
    }
    for (local_50 = 0; local_50 < (int)(*(uint *)&pGVar4->field_0x4 >> 9); local_50 = local_50 + 1)
    {
      pGVar5 = Gla_ManObj(p,pGVar4->Fanins[local_50]);
      if ((*(uint *)&pGVar5->field_0x4 & 1) == 0) {
        local_90 = vPPis;
        if ((*(uint *)&pGVar5->field_0x4 >> 3 & 1) != 0) {
          local_90 = vPis;
        }
        Vec_IntPush(local_90,pGVar5->iGiaObj);
      }
    }
    local_4c = local_4c + 1;
  }
  __assert_fail("pObj->fConst || pObj->fRo || pObj->fAnd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                ,0xf0,
                "void Gla_ManCollect(Gla_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

void Gla_ManCollect( Gla_Man_t * p, Vec_Int_t * vPis, Vec_Int_t * vPPis, Vec_Int_t * vCos, Vec_Int_t * vRoAnds )
{
    Gla_Obj_t * pObj, * pFanin; 
    Gia_Obj_t * pGiaObj;
    int i, k;

    // collect COs
    Vec_IntPush( vCos, Gia_ObjId(p->pGia, Gia_ManPo(p->pGia, 0)) );
    // collect fanins of abstracted objects
    Gla_ManForEachObjAbs( p, pObj, i )
    {
        assert( pObj->fConst || pObj->fRo || pObj->fAnd );
        if ( pObj->fRo )
        {
            pGiaObj = Gia_ObjRoToRi( p->pGia, Gia_ManObj(p->pGia, pObj->iGiaObj) );
            Vec_IntPush( vCos, Gia_ObjId(p->pGia, pGiaObj) );
        }
        Gla_ObjForEachFanin( p, pObj, pFanin, k )
            if ( !pFanin->fAbs )
                Vec_IntPush( (pFanin->fPi ? vPis : vPPis), pFanin->iGiaObj );
    }
    Vec_IntUniqify( vPis );
    Vec_IntUniqify( vPPis );
    Vec_IntSort( vCos, 0 );
    // sorting PIs/PPIs/COs leads to refinements that are more "well-aligned"...

    // mark const/PIs/PPIs
    Gia_ManIncrementTravId( p->pGia );
    Gia_ObjSetTravIdCurrent( p->pGia, Gia_ManConst0(p->pGia) );
    Gia_ManForEachObjVec( vPis, p->pGia, pGiaObj, i )
        Gia_ObjSetTravIdCurrent( p->pGia, pGiaObj );
    Gia_ManForEachObjVec( vPPis, p->pGia, pGiaObj, i )
        Gia_ObjSetTravIdCurrent( p->pGia, pGiaObj );
    // mark and add ROs first
    Gia_ManForEachObjVec( vCos, p->pGia, pGiaObj, i )
    {
        if ( i == 0 ) continue;
        pGiaObj = Gia_ObjRiToRo( p->pGia, pGiaObj );
        Gia_ObjSetTravIdCurrent( p->pGia, pGiaObj );
        Vec_IntPush( vRoAnds, Gia_ObjId(p->pGia, pGiaObj) );
    }
    // collect nodes between PIs/PPIs/ROs and COs
    Gia_ManForEachObjVec( vCos, p->pGia, pGiaObj, i )
        Gla_ManCollectInternal_rec( p->pGia, Gia_ObjFanin0(pGiaObj), vRoAnds );
}